

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UniformBufferStorageTestCase::execute
          (UniformBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  GLenum GVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar7 = 0;
  (*this->m_gl->bindBufferRange)
            (0x8a11,0,this->m_sparse_bo,(ulong)this->m_sparse_bo_data_start_offset,
             (ulong)this->m_sparse_bo_data_size);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1880);
  bVar5 = true;
  do {
    uVar3 = 0;
    uVar4 = 0;
    if ((int)lVar7 != 2) {
      if ((int)lVar7 == 1) {
        uVar4 = this->m_sparse_bo_data_start_offset;
        uVar3 = this->m_sparse_bo_data_size >> 1;
      }
      else {
        uVar3 = this->m_sparse_bo_data_size;
        uVar4 = this->m_sparse_bo_data_start_offset;
      }
    }
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,(ulong)uVar4,(ulong)uVar3,'\x01');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b1);
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,(ulong)uVar4,(ulong)uVar3);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b6);
    (*this->m_gl->useProgram)(this->m_po);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ba);
    (*this->m_gl->beginTransformFeedback)(0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18bd);
    (*this->m_gl->drawArrays)(0,0,this->m_n_ubo_uints);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c1);
    (*this->m_gl->endTransformFeedback)();
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c4);
    pvVar2 = (*this->m_gl->mapBuffer)(0x8c8e,35000);
    uVar6 = this->m_sparse_bo_data_start_offset;
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18cb);
    if ((ulong)this->m_n_ubo_uints == 0) {
      bVar9 = true;
    }
    else {
      uVar8 = 0;
      do {
        bVar9 = *(uint *)((long)pvVar2 + uVar8 * 4) ==
                (uint)(uVar8 == 0 || uVar6 < uVar3 + uVar4 && uVar4 <= uVar6);
        if (!bVar9) {
          local_1b0._0_8_ = this->m_testCtx->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Invalid value (",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,") found at index (",0x12);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"), instead of the expected value (",0x22);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"). Iteration index:(",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_138);
          break;
        }
        uVar8 = uVar8 + 1;
        uVar6 = uVar6 + 4;
      } while (uVar8 < this->m_n_ubo_uints);
    }
    bVar5 = (bool)(bVar5 & bVar9);
    (*this->m_gl->unmapBuffer)(0x8c8e);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18fc);
    (*this->m_gl->clearBufferData)(0x8c8e,0x8229,0x1903,0x1401,"");
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glClearBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ff);
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1902);
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool UniformBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBufferRange(GL_UNIFORM_BUFFER, 0, /* index */
						 m_sparse_bo, m_sparse_bo_data_start_offset, m_sparse_bo_data_size);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Run the test in three iterations:
	 *
	 * 1) Whole UBO storage is backed by physical backing.
	 * 2) Half the UBO storage is backed by physical backing.
	 * 3) None of the UBO storage is backed by physical backing.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool		 result_local			 = true;
		unsigned int ubo_commit_size		 = 0;
		unsigned int ubo_commit_start_offset = 0;

		switch (n_iteration)
		{
		case 0:
		{
			ubo_commit_size			= m_sparse_bo_data_size;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 1:
		{
			DE_ASSERT((m_sparse_bo_data_size % 2) == 0);
			DE_ASSERT((m_sparse_bo_data_size % m_page_size) == 0);

			ubo_commit_size			= m_sparse_bo_data_size / 2;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 2:
		{
			/* The default values do just fine */

			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, ubo_commit_start_offset, ubo_commit_size, GL_TRUE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		/* Copy the UBO data */
		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   ubo_commit_start_offset, ubo_commit_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		/* Issue the draw call to execute the test */
		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginTransformFeedback() call failed.");

		m_gl.drawArrays(GL_POINTS, 0, /* first */
						m_n_ubo_uints);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		m_gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndTransformFeedback() call failed.");

		/* Retrieve the data, verify the output */
		const unsigned int* result_data_ptr =
			(const unsigned int*)m_gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		unsigned int ubo_data_offset = m_sparse_bo_data_start_offset;

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

		for (unsigned int n_vertex = 0; n_vertex < m_n_ubo_uints && result_local;
			 ++n_vertex, ubo_data_offset = static_cast<unsigned int>(ubo_data_offset + sizeof(unsigned int)))
		{
			const bool is_ub_data_physically_backed = (ubo_data_offset >= ubo_commit_start_offset &&
													   ubo_data_offset < (ubo_commit_start_offset + ubo_commit_size)) ?
														  1 :
														  0;
			unsigned int	   expected_value  = -1;
			const unsigned int retrieved_value = result_data_ptr[n_vertex];

			if (is_ub_data_physically_backed)
			{
				expected_value = 1;
			}
			else
			{
				/* Read ops applied against non-committed sparse buffers should return 0, so the comparison
				 * performed in the vertex shader should result in 1 being written to the TF region.
				 */
				expected_value = (n_vertex == 0) ? 1 : 0;
			}

			if (expected_value != retrieved_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value "
															   "("
								   << retrieved_value << ") "
														 "found at index "
														 "("
								   << n_vertex << ")"
												  ", instead of the expected value "
												  "("
								   << expected_value << ")"
														". Iteration index:"
														"("
								   << n_iteration << ")" << tcu::TestLog::EndMessage;

				result_local = false;
			}
		}

		result &= result_local;

		/* Clean up in anticipation for the next iteration */
		static const unsigned char data_zero_r8 = 0;

		m_gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		m_gl.clearBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &data_zero_r8);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, 0, m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (all three iterations) */

	return result;
}